

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

PackedSlice * __thiscall
kratos::PortPackedStruct::operator[](PortPackedStruct *this,string *member_name)

{
  undefined1 auVar1 [8];
  uint32_t uVar2;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  PortPackedStruct *local_78;
  undefined8 uStack_70;
  PortPackedStruct *local_60;
  undefined8 uStack_58;
  undefined1 local_40 [8];
  shared_ptr<kratos::PackedSlice> ptr;
  
  uVar2 = (*(this->super_Port).super_Var.super_IRNode._vptr_IRNode[7])();
  if (uVar2 == (this->super_Port).super_Var.var_width_) {
    local_40 = (undefined1  [8])0x0;
    local_60 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::PackedSlice,std::allocator<kratos::PackedSlice>,kratos::PortPackedStruct*,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr,(PackedSlice **)local_40,
               (allocator<kratos::PackedSlice> *)&local_78,&local_60,member_name);
    std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::PackedSlice,kratos::PackedSlice>
              ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)local_40,
               (PackedSlice *)local_40);
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&(this->super_Port).super_Var.slices_,(shared_ptr<kratos::PackedSlice> *)local_40)
    ;
    auVar1 = local_40;
    if (ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return (PackedSlice *)auVar1;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Port).super_Var.super_IRNode._vptr_IRNode[0x1f])(&local_60,this);
  local_78 = local_60;
  uStack_70 = uStack_58;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x31;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_40,(detail *)"Unable to access member of {0}, which is an array",
             format_str,args);
  UserException::UserException(this_00,(string *)local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice& PortPackedStruct::operator[](const std::string& member_name) {
    if (width() != var_width())
        throw UserException(
            ::format("Unable to access member of {0}, which is an array", to_string()));
    auto ptr = std::make_shared<PackedSlice>(this, member_name);
    slices_.emplace_back(ptr);
    return *ptr;
}